

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack9_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 0x1ff;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 9 & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = *in >> 0x12 & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = *in >> 0x1b;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0xf) << 5 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = *puVar2 >> 4 & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 0xd & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0x16 & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x1f;
  *puVar1 = (in[2] & 0xff) << 1 | *puVar1;
  *puVar1 = base + *puVar1;
  return in + 3;
}

Assistant:

uint32_t * unpack9_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  9  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  27  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 9 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  13  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  31  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 9 - 8 );
    *out += base;
    out++;

    return in + 1;
}